

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgUtils.hpp
# Opt level: O2

unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
__thiscall
TasGrid::Utils::make_unique<TasGrid::GridLocalPolynomial,TasGrid::AccelerationContext_const*&>
          (Utils *this,AccelerationContext **args)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x150);
  puVar1[1] = *args;
  *(undefined4 *)(puVar1 + 4) = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  *(undefined4 *)(puVar1 + 9) = 0;
  puVar1[0x10] = 0;
  puVar1[0x11] = 0;
  puVar1[0xe] = 0;
  puVar1[0xf] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  *puVar1 = &PTR__GridLocalPolynomial_001ff610;
  *(undefined4 *)(puVar1 + 0x12) = 1;
  memset((void *)((long)puVar1 + 0x94),0,0x9c);
  puVar1[0x29] = 0;
  puVar1[0x27] = 0;
  puVar1[0x28] = 0;
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args){
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}